

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O1

void __thiscall helics::udp::UdpComms::queue_tx_function(UdpComms *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TriggerVariable *this_00;
  string *psVar2;
  promise<int> *this_01;
  socklen_t *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Rb_tree_header *p_Var5;
  io_context *owner;
  undefined8 uVar6;
  pointer pcVar7;
  uint uVar8;
  undefined8 uVar9;
  bool bVar10;
  action_t aVar11;
  uint uVar12;
  bool bVar13;
  int iVar14;
  int32_t iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  size_t sVar21;
  undefined8 *data;
  long lVar22;
  int *piVar23;
  string *address;
  _Base_ptr p_Var24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar25;
  long lVar26;
  _Base_ptr p_Var27;
  int __oflag;
  ulong uVar28;
  ActionMessage *extraout_RDX;
  ActionMessage *extraout_RDX_00;
  ActionMessage *extraout_RDX_01;
  ActionMessage *extraout_RDX_02;
  ActionMessage *extraout_RDX_03;
  ActionMessage *pAVar29;
  ActionMessage *extraout_RDX_04;
  ActionMessage *extraout_RDX_05;
  ActionMessage *extraout_RDX_06;
  ActionMessage *extraout_RDX_07;
  ActionMessage *extraout_RDX_08;
  ActionMessage *extraout_RDX_09;
  ActionMessage *command;
  void *pvVar30;
  byte bVar31;
  byte bVar32;
  _Alloc_hider _Var33;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar34;
  byte bVar35;
  value_type *__val;
  uint uVar36;
  _Rb_tree_header *p_Var37;
  bool bVar38;
  string_view string1;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  string_view message_09;
  string_view message_10;
  string_view message_11;
  string_view message_12;
  string_view message_13;
  string_view message_14;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  string_view string2;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
  pVar39;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>,_bool>
  pVar40;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  error_code error;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  int local_3b8;
  ActionMessage cmd;
  string port;
  query query;
  endpoint rxEndpoint;
  query localQuery;
  endpoint broker_endpoint;
  route_id local_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  results_type local_138;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  socket transmitSocket;
  map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
  routes;
  resolver resolver;
  
  cmd.source_id.gid = 0;
  cmd.source_handle.hid = 0;
  cmd._16_8_ = cmd._16_8_ & 0xffffffffffffff00;
  cmd._0_8_ = &cmd.dest_id;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)&ioctx,(string *)&cmd);
  if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
    operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>
            (&resolver.impl_,0,0,
             ((ioctx.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
  owner = ((ioctx.
            super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->ictx)._M_t.
          super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
          super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
          super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  cmd._0_8_ = &asio::detail::typeid_wrapper<asio::detail::reactive_socket_service<asio::ip::udp>>::
               typeinfo;
  cmd.source_id.gid = 0;
  cmd.source_handle.hid = 0;
  transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.service_ =
       (service_type *)
       asio::detail::service_registry::do_use_service
                 ((owner->super_execution_context).service_registry_,(key *)&cmd,
                  asio::detail::service_registry::
                  create<asio::detail::reactive_socket_service<asio::ip::udp>,asio::io_context>,
                  owner);
  transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_ =
       &transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_;
  transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  protocol_.family_ = 2;
  transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_fns_ =
       (target_fns *)
       asio::execution::detail::any_executor_base::
       target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value,void>::type*)
       ::fns_with_execute;
  transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_fns_ =
       (object_fns *)
       asio::execution::detail::any_executor_base::
       object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,asio::execution::detail::shared_target_executor>::value),void>::type*)
       ::fns;
  transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .prop_fns_ = (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)asio::execution::
                  any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
                  ::
                  prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>()
                  ::fns;
  transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.socket_ = -1;
  transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.state_ = '\0';
  transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.reactor_data_ = (per_descriptor_data)0x0;
  cmd.messageAction =
       (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) * 8
       + cmd_user_disconnect;
  transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_.data._0_8_ = owner;
  asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
            (&transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(char *)&cmd,
             __oflag);
  if (-1 < (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i) {
    cmd.messageAction = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i
    ;
    std::promise<int>::set_value(&this->promisePort,&cmd.messageAction);
  }
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &routes._M_t._M_impl.super__Rb_tree_header._M_header;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  routes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  broker_endpoint.impl_.data_._8_4_ = 0;
  broker_endpoint.impl_.data_._12_4_ = 0;
  broker_endpoint.impl_.data_._16_4_ = 0;
  broker_endpoint.impl_.data_._20_4_ = 0;
  broker_endpoint.impl_.data_.v6.sin6_scope_id = 0;
  broker_endpoint.impl_.data_._0_8_ = 2;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
    if ((this->super_NetworkCommsInterface).brokerPort < 0) {
      iVar14 = getDefaultPort(7);
      (this->super_NetworkCommsInterface).brokerPort = iVar14;
    }
    localQuery.hints_.ai_flags =
         (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) *
         8 + 2;
    uVar18 = (this->super_NetworkCommsInterface).brokerPort;
    uVar8 = -uVar18;
    if (0 < (int)uVar18) {
      uVar8 = uVar18;
    }
    uVar36 = 1;
    if (9 < uVar8) {
      uVar28 = (ulong)uVar8;
      uVar12 = 4;
      do {
        uVar36 = uVar12;
        uVar17 = (uint)uVar28;
        if (uVar17 < 100) {
          uVar36 = uVar36 - 2;
          goto LAB_002ac38f;
        }
        if (uVar17 < 1000) {
          uVar36 = uVar36 - 1;
          goto LAB_002ac38f;
        }
        if (uVar17 < 10000) goto LAB_002ac38f;
        uVar28 = uVar28 / 10000;
        uVar12 = uVar36 + 4;
      } while (99999 < uVar17);
      uVar36 = uVar36 + 1;
    }
LAB_002ac38f:
    cmd._0_8_ = &cmd.dest_id;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmd,
                 (ulong)(uVar36 + -((int)uVar18 >> 0x1f)),'-');
    psVar2 = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uint)-((int)uVar18 >> 0x1f) + cmd._0_8_),uVar36,uVar8);
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              (&query,(protocol_type *)&localQuery,psVar2,(string *)&cmd,address_configured);
    if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
      operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
    }
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((results_type *)&cmd,&resolver,&query);
    lVar20 = *(long *)cmd._0_8_;
    lVar19 = cmd._16_8_ * 0x60;
    broker_endpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(lVar20 + 0x18 + lVar19);
    uVar6 = *(undefined8 *)(lVar20 + 0x10 + lVar19);
    broker_endpoint.impl_.data_._0_8_ = *(undefined8 *)(lVar20 + lVar19);
    uVar9 = ((undefined8 *)(lVar20 + lVar19))[1];
    broker_endpoint.impl_.data_._8_4_ = (undefined4)uVar9;
    broker_endpoint.impl_.data_._12_4_ = (undefined4)((ulong)uVar9 >> 0x20);
    broker_endpoint.impl_.data_._16_4_ = (undefined4)uVar6;
    broker_endpoint.impl_.data_._20_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    if (cmd._8_8_ != 0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cmd._8_8_);
    }
    bVar35 = (this->super_NetworkCommsInterface).noAckConnection;
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
      bVar35 = 0;
    }
    lVar20 = std::chrono::_V2::steady_clock::now();
    bVar38 = true;
    if ((bVar35 & 1) == 0) {
      iVar14 = 0;
      this_01 = &this->promisePort;
      local_3b8 = 0;
LAB_002ac4cf:
      if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i &
          1U) == 0) {
        ActionMessage::ActionMessage(&cmd,cmd_protocol_priority);
        iVar15 = 0x12d;
        if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
          iVar15 = 0x5af;
        }
        cmd.messageID = iVar15;
        string1._M_str =
             (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_dataplus._M_p;
        string1._M_len =
             (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_string_length;
        string2._M_str =
             (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString._M_dataplus.
             _M_p;
        string2._M_len =
             (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString.
             _M_string_length;
        ActionMessage::setStringData(&cmd,string1,string2);
        ActionMessage::to_string_abi_cxx11_((string *)&localQuery,&cmd);
        sVar21 = 0x1c;
        if (broker_endpoint.impl_.data_.base.sa_family == 2) {
          sVar21 = 0x10;
        }
        in_R9.values_ = (value<fmt::v11::context> *)&broker_endpoint;
        asio::detail::socket_ops::sync_sendto1
                  (transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                   implementation_.super_base_implementation_type.socket_,
                   transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                   implementation_.super_base_implementation_type.state_,
                   (void *)localQuery.hints_._0_8_,localQuery.hints_._8_8_,0,in_R9.values_,sVar21,
                   &error);
        if ((socklen_t *)localQuery.hints_._0_8_ != &localQuery.hints_.ai_addrlen) {
          operator_delete((void *)localQuery.hints_._0_8_,localQuery.hints_._16_8_ + 1);
        }
        if (error._M_value == 0) {
          data = (undefined8 *)operator_new(0x80);
          data[0xe] = 0;
          data[0xf] = 0;
          data[0xc] = 0;
          data[0xd] = 0;
          data[10] = 0;
          data[0xb] = 0;
          data[8] = 0;
          data[9] = 0;
          data[6] = 0;
          data[7] = 0;
          data[4] = 0;
          data[5] = 0;
          data[2] = 0;
          data[3] = 0;
          *data = 0;
          data[1] = 0;
          rxEndpoint.impl_.data_._8_4_ = 0;
          rxEndpoint.impl_.data_._12_4_ = 0;
          rxEndpoint.impl_.data_._16_4_ = 0;
          rxEndpoint.impl_.data_._20_4_ = 0;
          rxEndpoint.impl_.data_.v6.sin6_scope_id = 0;
          rxEndpoint.impl_.data_._0_8_ = 2;
          bVar38 = false;
          do {
            sVar21 = asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::available
                               (&transmitSocket.
                                 super_basic_socket<asio::ip::udp,_asio::any_io_executor>);
            iVar16 = iVar14;
            if ((sVar21 != 0) || (bVar38)) goto LAB_002ac753;
            lVar22 = std::chrono::_V2::steady_clock::now();
            lVar22 = lVar22 - lVar20;
            lVar19 = (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r;
            lVar26 = lVar19 * 1000000;
            if (lVar22 != lVar26 && SBORROW8(lVar22,lVar26) == lVar22 + lVar19 * -1000000 < 0) {
              bVar38 = true;
            }
            if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base.
                 _M_i & 1U) != 0) {
              if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1)
              {
                LOCK();
                (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
                UNLOCK();
                localQuery.hints_.ai_flags = -1;
                std::promise<int>::set_value(this_01,(int *)&localQuery);
              }
              CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
              bVar32 = 1;
              goto LAB_002acaf0;
            }
            localQuery.hints_.ai_flags = 0;
            localQuery.hints_.ai_family = 0;
            localQuery.hints_.ai_socktype = 50000000;
            localQuery.hints_.ai_protocol = 0;
            do {
              iVar16 = nanosleep((timespec *)&localQuery,(timespec *)&localQuery);
              if (iVar16 != -1) break;
              piVar23 = __errno_location();
            } while (*piVar23 == 4);
          } while( true );
        }
        (**(code **)(*(long *)error._M_cat + 0x20))(&brkprt);
        port._M_dataplus = brkprt.first._M_dataplus;
        port._M_string_length = brkprt.first._M_string_length;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&port;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x22;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&localQuery,(v11 *)"error in initial send to broker {}",fmt,args);
        message._M_str = (char *)localQuery.hints_._0_8_;
        message._M_len._0_4_ = localQuery.hints_.ai_socktype;
        message._M_len._4_4_ = localQuery.hints_.ai_protocol;
        CommsInterface::logError((CommsInterface *)this,message);
        if ((socklen_t *)localQuery.hints_._0_8_ != &localQuery.hints_.ai_addrlen) {
          operator_delete((void *)localQuery.hints_._0_8_,localQuery.hints_._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)brkprt.first._M_dataplus._M_p != &brkprt.first.field_2) {
          operator_delete(brkprt.first._M_dataplus._M_p,
                          CONCAT71(brkprt.first.field_2._M_allocated_capacity._1_7_,
                                   brkprt.first.field_2._M_local_buf[0]) + 1);
        }
        if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
          LOCK();
          (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
          UNLOCK();
          localQuery.hints_.ai_flags = -1;
          std::promise<int>::set_value(this_01,(int *)&localQuery);
        }
        bVar32 = 1;
        CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
        goto LAB_002acb02;
      }
      if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
        LOCK();
        (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
        UNLOCK();
        cmd.messageAction = cmd_broker_setup;
        std::promise<int>::set_value(this_01,&cmd.messageAction);
      }
      CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
      bVar38 = false;
    }
    goto LAB_002ace85;
  }
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    iVar14 = getDefaultPort(7);
    LOCK();
    (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar14;
    UNLOCK();
    cmd.messageAction = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i
    ;
    std::promise<int>::set_value(&this->promisePort,&cmd.messageAction);
  }
  goto LAB_002aced0;
LAB_002ac753:
  if (bVar38) {
    iVar16 = iVar14 + 1;
    bVar32 = 2;
    if ((this->super_NetworkCommsInterface).maxRetries <= iVar14) {
      message_02._M_str = "the max number of retries has been exceeded";
      message_02._M_len = 0x2b;
      CommsInterface::logError((CommsInterface *)this,message_02);
      if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
        LOCK();
        (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
        UNLOCK();
        localQuery.hints_.ai_flags = -1;
        std::promise<int>::set_value(this_01,(int *)&localQuery);
      }
      CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
      bVar32 = 1;
    }
    goto LAB_002acaf0;
  }
  localQuery.hints_.ai_socktype = 0x80;
  localQuery.hints_.ai_protocol = 0;
  in_R9.values_ = (value<fmt::v11::context> *)&error;
  localQuery.hints_._0_8_ = data;
  sVar21 = asio::detail::reactive_socket_service<asio::ip::udp>::
           receive_from<asio::mutable_buffers_1>
                     (transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                      service_,&transmitSocket.
                                super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                                implementation_,(mutable_buffers_1 *)&localQuery,&rxEndpoint,0,
                      &error);
  if (error._M_value == 0) {
    ActionMessage::ActionMessage((ActionMessage *)&localQuery,data,sVar21);
    ActionMessage::operator=(&cmd,(ActionMessage *)&localQuery);
    ActionMessage::~ActionMessage((ActionMessage *)&localQuery);
    bVar32 = 0;
    bVar31 = 0;
    if (((cmd.messageAction != cmd_protocol_priority) && (cmd.messageAction != cmd_protocol_big)) &&
       (cmd.messageAction != cmd_protocol)) goto LAB_002acaf0;
    if (0x5aa < cmd.messageID) {
      if (cmd.messageID == 0xed3) {
        localQuery.hints_.ai_flags = 2;
        localQuery.hints_.ai_family = 0;
        localQuery.hints_.ai_socktype = 0;
        localQuery.hints_.ai_protocol = 0;
        do {
          iVar14 = nanosleep((timespec *)&localQuery,(timespec *)&localQuery);
          bVar32 = bVar31;
          if (iVar14 != -1) break;
          piVar23 = __errno_location();
        } while (*piVar23 == 4);
      }
      else if (cmd.messageID == 0x9db) {
        if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
          LOCK();
          (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
          UNLOCK();
          localQuery.hints_.ai_flags = -1;
          std::promise<int>::set_value(this_01,(int *)&localQuery);
        }
        CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
        bVar32 = 1;
      }
      else if (cmd.messageID == 0x5ab) {
        NetworkCommsInterface::loadPortDefinitions(&this->super_NetworkCommsInterface,&cmd);
        localQuery.hints_.ai_flags =
             (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
        std::promise<int>::set_value(this_01,(int *)&localQuery);
        bVar35 = 1;
      }
      goto LAB_002acaf0;
    }
    if (cmd.messageID == 0x130) {
      iVar14 = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
      if (0 < iVar14) {
        bVar35 = 1;
      }
      bVar32 = (0 < iVar14) * '\x02';
      goto LAB_002acaf0;
    }
    bVar32 = bVar31;
    if (cmd.messageID != 0x14d) goto LAB_002acaf0;
    message_03._M_str = "got new broker information";
    message_03._M_len = 0x1a;
    CommsInterface::logMessage((CommsInterface *)this,message_03);
    address = ActionMessage::getString_abi_cxx11_(&cmd,0);
    gmlc::networking::extractInterfaceAndPort(&brkprt,(string *)address);
    (this->super_NetworkCommsInterface).brokerPort = brkprt.second;
    iVar14 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&brkprt,
                     "?");
    if (iVar14 != 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(local_140,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&brkprt);
    }
    local_138.super_basic_resolver_iterator<asio::ip::udp>.values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::udp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::udp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) *
         8 + 2;
    uVar18 = (this->super_NetworkCommsInterface).brokerPort;
    uVar8 = -uVar18;
    if (0 < (int)uVar18) {
      uVar8 = uVar18;
    }
    uVar36 = 1;
    if (9 < uVar8) {
      uVar28 = (ulong)uVar8;
      uVar12 = 4;
      do {
        uVar36 = uVar12;
        uVar17 = (uint)uVar28;
        if (uVar17 < 100) {
          uVar36 = uVar36 - 2;
          goto LAB_002accca;
        }
        if (uVar17 < 1000) {
          uVar36 = uVar36 - 1;
          goto LAB_002accca;
        }
        if (uVar17 < 10000) goto LAB_002accca;
        uVar28 = uVar28 / 10000;
        uVar12 = uVar36 + 4;
      } while (99999 < uVar17);
      uVar36 = uVar36 + 1;
    }
LAB_002accca:
    port._M_dataplus._M_p = (pointer)&port.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port,
                 (ulong)(uVar36 + -((int)uVar18 >> 0x1f)),'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>
              (port._M_dataplus._M_p + (uint)-((int)uVar18 >> 0x1f),uVar36,uVar8);
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&localQuery,(protocol_type *)&local_138,
               (string *)local_140,&port,address_configured);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)port._M_dataplus._M_p != &port.field_2) {
      operator_delete(port._M_dataplus._M_p,
                      CONCAT71(port.field_2._M_allocated_capacity._1_7_,port.field_2._M_local_buf[0]
                              ) + 1);
    }
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((results_type *)&port,&resolver,&localQuery);
    lVar19 = *(long *)port._M_dataplus._M_p;
    lVar22 = CONCAT71(port.field_2._M_allocated_capacity._1_7_,port.field_2._M_local_buf[0]) * 0x60;
    broker_endpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(lVar19 + 0x18 + lVar22);
    uVar6 = *(undefined8 *)(lVar19 + 0x10 + lVar22);
    broker_endpoint.impl_.data_._0_8_ = *(undefined8 *)(lVar19 + lVar22);
    uVar9 = ((undefined8 *)(lVar19 + lVar22))[1];
    broker_endpoint.impl_.data_._8_4_ = (undefined4)uVar9;
    broker_endpoint.impl_.data_._12_4_ = (undefined4)((ulong)uVar9 >> 0x20);
    broker_endpoint.impl_.data_._16_4_ = (undefined4)uVar6;
    broker_endpoint.impl_.data_._20_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    if (port._M_string_length != 0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)port._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)localQuery.service_name_._M_dataplus._M_p != &localQuery.service_name_.field_2) {
      operator_delete(localQuery.service_name_._M_dataplus._M_p,
                      localQuery.service_name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)localQuery.host_name_._M_dataplus._M_p != &localQuery.host_name_.field_2) {
      operator_delete(localQuery.host_name_._M_dataplus._M_p,
                      localQuery.host_name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)brkprt.first._M_dataplus._M_p != &brkprt.first.field_2) {
      operator_delete(brkprt.first._M_dataplus._M_p,
                      CONCAT71(brkprt.first.field_2._M_allocated_capacity._1_7_,
                               brkprt.first.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    if (local_3b8 == 0) {
      (**(code **)(*(long *)error._M_cat + 0x20))(&brkprt);
      port._M_dataplus = brkprt.first._M_dataplus;
      port._M_string_length = brkprt.first._M_string_length;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&port;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x22;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&localQuery,(v11 *)"error in initial receive broker {}",fmt_00,args_00);
      message_00._M_str = (char *)localQuery.hints_._0_8_;
      message_00._M_len._0_4_ = localQuery.hints_.ai_socktype;
      message_00._M_len._4_4_ = localQuery.hints_.ai_protocol;
      CommsInterface::logError((CommsInterface *)this,message_00);
      if ((socklen_t *)localQuery.hints_._0_8_ != &localQuery.hints_.ai_addrlen) {
        operator_delete((void *)localQuery.hints_._0_8_,localQuery.hints_._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)brkprt.first._M_dataplus._M_p != &brkprt.first.field_2) {
        operator_delete(brkprt.first._M_dataplus._M_p,
                        CONCAT71(brkprt.first.field_2._M_allocated_capacity._1_7_,
                                 brkprt.first.field_2._M_local_buf[0]) + 1);
      }
    }
    local_3b8 = local_3b8 + 1;
    lVar22 = std::chrono::_V2::steady_clock::now();
    lVar22 = lVar22 - lVar20;
    lVar19 = (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r;
    lVar26 = lVar19 * 1000000;
    if (lVar22 != lVar26 && SBORROW8(lVar22,lVar26) == lVar22 + lVar19 * -1000000 < 0) {
      if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
        LOCK();
        (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
        UNLOCK();
        localQuery.hints_.ai_flags = -1;
        std::promise<int>::set_value(this_01,(int *)&localQuery);
      }
      CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
      (**(code **)(*(long *)error._M_cat + 0x20))(&brkprt,error._M_cat,error._M_value);
      port._M_dataplus = brkprt.first._M_dataplus;
      port._M_string_length = brkprt.first._M_string_length;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&port;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x1e;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&localQuery,(v11 *)"timeerror in broker receive {}",fmt_01,args_01);
      message_01._M_str = (char *)localQuery.hints_._0_8_;
      message_01._M_len._0_4_ = localQuery.hints_.ai_socktype;
      message_01._M_len._4_4_ = localQuery.hints_.ai_protocol;
      CommsInterface::logError((CommsInterface *)this,message_01);
      if ((socklen_t *)localQuery.hints_._0_8_ != &localQuery.hints_.ai_addrlen) {
        operator_delete((void *)localQuery.hints_._0_8_,localQuery.hints_._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)brkprt.first._M_dataplus._M_p != &brkprt.first.field_2) {
        operator_delete(brkprt.first._M_dataplus._M_p,
                        CONCAT71(brkprt.first.field_2._M_allocated_capacity._1_7_,
                                 brkprt.first.field_2._M_local_buf[0]) + 1);
      }
      bVar32 = 1;
      goto LAB_002acaf0;
    }
    localQuery.hints_.ai_flags = 0;
    localQuery.hints_.ai_family = 0;
    localQuery.hints_.ai_socktype = 200000000;
    localQuery.hints_.ai_protocol = 0;
    do {
      iVar14 = nanosleep((timespec *)&localQuery,(timespec *)&localQuery);
      if (iVar14 != -1) break;
      piVar23 = __errno_location();
    } while (*piVar23 == 4);
  }
  bVar32 = 2;
LAB_002acaf0:
  operator_delete(data,0x80);
  iVar14 = iVar16;
LAB_002acb02:
  ActionMessage::~ActionMessage(&cmd);
  if ((bVar32 & 1) != 0) goto LAB_002ace7f;
  if ((bVar35 & 1) != 0) goto LAB_002ace7d;
  goto LAB_002ac4cf;
LAB_002ace7d:
  bVar32 = 0;
LAB_002ace7f:
  bVar38 = bVar32 == 0;
LAB_002ace85:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)query.service_name_._M_dataplus._M_p != &query.service_name_.field_2) {
    operator_delete(query.service_name_._M_dataplus._M_p,
                    query.service_name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)query.host_name_._M_dataplus._M_p != &query.host_name_.field_2) {
    operator_delete(query.host_name_._M_dataplus._M_p,
                    query.host_name_.field_2._M_allocated_capacity + 1);
  }
  if (!bVar38) goto LAB_002ae074;
LAB_002aced0:
  rxEndpoint.impl_.data_._8_4_ = 0;
  rxEndpoint.impl_.data_._12_4_ = 0;
  rxEndpoint.impl_.data_._16_4_ = 0;
  rxEndpoint.impl_.data_._20_4_ = 0;
  rxEndpoint.impl_.data_.v6.sin6_scope_id = 0;
  rxEndpoint.impl_.data_._0_8_ = 2;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress._M_string_length
      == 0) {
LAB_002acfba:
    brkprt.first._M_dataplus._M_p._0_4_ =
         (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) *
         8 + 2;
    localQuery.hints_._0_8_ = &localQuery.hints_.ai_addrlen;
    std::__cxx11::string::_M_construct<char_const*>((string *)&localQuery,"127.0.0.1","");
    uVar18 = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
    uVar8 = -uVar18;
    if (0 < (int)uVar18) {
      uVar8 = uVar18;
    }
    uVar36 = 1;
    if (9 < uVar8) {
      uVar28 = (ulong)uVar8;
      uVar12 = 4;
      do {
        uVar36 = uVar12;
        uVar17 = (uint)uVar28;
        if (uVar17 < 100) {
          uVar36 = uVar36 - 2;
          goto LAB_002ad05c;
        }
        if (uVar17 < 1000) {
          uVar36 = uVar36 - 1;
          goto LAB_002ad05c;
        }
        if (uVar17 < 10000) goto LAB_002ad05c;
        uVar28 = uVar28 / 10000;
        uVar12 = uVar36 + 4;
      } while (99999 < uVar17);
      uVar36 = uVar36 + 1;
    }
LAB_002ad05c:
    psVar3 = &query.hints_.ai_addrlen;
    query.hints_._0_8_ = psVar3;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&query,
                 (ulong)(uVar36 + -((int)uVar18 >> 0x1f)),'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uint)-((int)uVar18 >> 0x1f) + query.hints_._0_8_),uVar36,uVar8);
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&cmd,(protocol_type *)&brkprt,
               (string *)&localQuery,(string *)&query,address_configured);
    if ((socklen_t *)query.hints_._0_8_ != psVar3) {
      operator_delete((void *)query.hints_._0_8_,query.hints_._16_8_ + 1);
    }
    if ((socklen_t *)localQuery.hints_._0_8_ != &localQuery.hints_.ai_addrlen) {
      operator_delete((void *)localQuery.hints_._0_8_,localQuery.hints_._16_8_ + 1);
    }
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((results_type *)&localQuery,&resolver,(query *)&cmd);
    lVar20 = *(long *)localQuery.hints_._0_8_;
    lVar19 = localQuery.hints_._16_8_ * 0x60;
    rxEndpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(lVar20 + 0x18 + lVar19);
    uVar6 = *(undefined8 *)(lVar20 + 0x10 + lVar19);
    rxEndpoint.impl_.data_._0_8_ = *(undefined8 *)(lVar20 + lVar19);
    uVar9 = ((undefined8 *)(lVar20 + lVar19))[1];
    rxEndpoint.impl_.data_._8_4_ = (undefined4)uVar9;
    rxEndpoint.impl_.data_._12_4_ = (undefined4)((ulong)uVar9 >> 0x20);
    rxEndpoint.impl_.data_._16_4_ = (undefined4)uVar6;
    rxEndpoint.impl_.data_._20_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    if (localQuery.hints_._8_8_ != 0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)localQuery.hints_._8_8_);
    }
    if ((byte *)cmd.payload.buffer._M_elems._16_8_ != cmd.payload.buffer._M_elems + 0x20) {
      operator_delete((void *)cmd.payload.buffer._M_elems._16_8_,
                      cmd.payload.buffer._M_elems._32_8_ + 1);
    }
    if ((SmallBuffer *)cmd.Tdemin.internalTimeCode != &cmd.payload) {
      operator_delete((void *)cmd.Tdemin.internalTimeCode,cmd.payload.buffer._M_elems._0_8_ + 1);
    }
  }
  else {
    psVar2 = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
    iVar14 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2,"*"
                    );
    if ((iVar14 == 0) ||
       (iVar14 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            psVar2,"udp://*"), iVar14 == 0)) goto LAB_002acfba;
    query.hints_.ai_flags =
         (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) *
         8 + 2;
    uVar18 = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
    uVar8 = -uVar18;
    if (0 < (int)uVar18) {
      uVar8 = uVar18;
    }
    uVar36 = 1;
    if (9 < uVar8) {
      uVar28 = (ulong)uVar8;
      uVar12 = 4;
      do {
        uVar36 = uVar12;
        uVar17 = (uint)uVar28;
        if (uVar17 < 100) {
          uVar36 = uVar36 - 2;
          goto LAB_002ae0c8;
        }
        if (uVar17 < 1000) {
          uVar36 = uVar36 - 1;
          goto LAB_002ae0c8;
        }
        if (uVar17 < 10000) goto LAB_002ae0c8;
        uVar28 = uVar28 / 10000;
        uVar12 = uVar36 + 4;
      } while (99999 < uVar17);
      uVar36 = uVar36 + 1;
    }
LAB_002ae0c8:
    localQuery.hints_._0_8_ = &localQuery.hints_.ai_addrlen;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&localQuery,
                 (ulong)(uVar36 + -((int)uVar18 >> 0x1f)),'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uint)-((int)uVar18 >> 0x1f) + localQuery.hints_._0_8_),uVar36,uVar8)
    ;
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&cmd,(protocol_type *)&query,psVar2,
               (string *)&localQuery,address_configured);
    psVar3 = &localQuery.hints_.ai_addrlen;
    if ((socklen_t *)localQuery.hints_._0_8_ != psVar3) {
      operator_delete((void *)localQuery.hints_._0_8_,localQuery.hints_._16_8_ + 1);
    }
    asio::detail::resolver_service<asio::ip::udp>::resolve
              ((results_type *)&query,resolver.impl_.service_,&resolver.impl_.implementation_,
               (query_type *)&cmd,&error);
    iVar14 = error._M_value;
    if (error._M_value == 0) {
      lVar20 = *(long *)query.hints_._0_8_;
      lVar19 = query.hints_._16_8_ * 0x60;
      rxEndpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(lVar20 + 0x18 + lVar19);
      uVar6 = *(undefined8 *)(lVar20 + 0x10 + lVar19);
      rxEndpoint.impl_.data_._0_8_ = *(undefined8 *)(lVar20 + lVar19);
      uVar9 = ((undefined8 *)(lVar20 + lVar19))[1];
      rxEndpoint.impl_.data_._8_4_ = (undefined4)uVar9;
      rxEndpoint.impl_.data_._12_4_ = (undefined4)((ulong)uVar9 >> 0x20);
      rxEndpoint.impl_.data_._16_4_ = (undefined4)uVar6;
      rxEndpoint.impl_.data_._20_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    }
    else {
      brkprt.first._M_dataplus._M_p =
           (this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress._M_dataplus.
           _M_p;
      brkprt.first._M_string_length =
           (this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress.
           _M_string_length;
      args_10.field_1.args_ = in_R9.args_;
      args_10.desc_ = (unsigned_long_long)&brkprt;
      fmt_10.size_ = 0xd;
      fmt_10.data_ = (char *)0x15;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&localQuery,(v11 *)"Unable to resolve: {}",fmt_10,args_10);
      message_13._M_str = (char *)localQuery.hints_._0_8_;
      message_13._M_len._0_4_ = localQuery.hints_.ai_socktype;
      message_13._M_len._4_4_ = localQuery.hints_.ai_protocol;
      CommsInterface::logError((CommsInterface *)this,message_13);
      if ((socklen_t *)localQuery.hints_._0_8_ != psVar3) {
        operator_delete((void *)localQuery.hints_._0_8_,localQuery.hints_._16_8_ + 1);
      }
      CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
    }
    if (query.hints_._8_8_ != 0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)query.hints_._8_8_);
    }
    if ((byte *)cmd.payload.buffer._M_elems._16_8_ != cmd.payload.buffer._M_elems + 0x20) {
      operator_delete((void *)cmd.payload.buffer._M_elems._16_8_,
                      cmd.payload.buffer._M_elems._32_8_ + 1);
    }
    if ((SmallBuffer *)cmd.Tdemin.internalTimeCode != &cmd.payload) {
      operator_delete((void *)cmd.Tdemin.internalTimeCode,cmd.payload.buffer._M_elems._0_8_ + 1);
    }
    if (iVar14 != 0) goto LAB_002ae074;
  }
  CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
  bVar38 = true;
  bVar13 = false;
  do {
    localQuery.hints_.ai_flags = 0;
    localQuery.hints_.ai_family = 0;
    localQuery.hints_.ai_socktype = 0;
    localQuery.hints_.ai_protocol = -1700000000;
    localQuery.hints_.ai_addrlen = 0;
    localQuery.hints_._20_4_ = 0x9aac0f00;
    localQuery.service_name_.field_2._8_8_ = 0;
    localQuery.service_name_._M_string_length = 0;
    localQuery.service_name_.field_2._M_allocated_capacity = 0;
    localQuery.host_name_.field_2._8_8_ = 0;
    localQuery.service_name_._M_dataplus._M_p = (pointer)0x0;
    localQuery.host_name_._M_string_length = 0;
    localQuery.host_name_.field_2._M_allocated_capacity = 0;
    localQuery.hints_.ai_next = (addrinfo *)0x0;
    localQuery.host_name_._M_dataplus._M_p = (pointer)0x0;
    localQuery.hints_.ai_addr = (sockaddr *)0x0;
    localQuery.hints_.ai_canonname = (char *)0x0;
    paVar4 = &localQuery.host_name_.field_2;
    gmlc::containers::
    BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
    ::pop((pair<helics::route_id,_helics::ActionMessage> *)&cmd,
          &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue);
    aVar11 = cmd.messageAction;
    ActionMessage::operator=((ActionMessage *)&localQuery,(ActionMessage *)&cmd.source_id);
    ActionMessage::~ActionMessage((ActionMessage *)&cmd.source_id);
    pAVar29 = extraout_RDX;
    if ((((localQuery.hints_.ai_flags == -60000) || (localQuery.hints_.ai_flags == 0x1000ea60)) ||
        (localQuery.hints_.ai_flags == 60000)) && (aVar11 == cmd_broker_setup)) {
      bVar10 = false;
      if (localQuery.hints_.ai_family < 0x9db) {
        if (localQuery.hints_.ai_family == 0xf4) {
          cmd.messageAction = localQuery.hints_._20_4_;
          pVar39 = std::
                   _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>,_std::_Select1st<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
                   ::equal_range(&routes._M_t,(key_type *)&cmd);
          std::
          _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>,_std::_Select1st<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
          ::_M_erase_aux(&routes._M_t,(_Base_ptr)pVar39.first._M_node,
                         (_Base_ptr)pVar39.second._M_node);
          pAVar29 = extraout_RDX_03;
        }
        else {
          if (localQuery.hints_.ai_family != 0xe9) goto LAB_002ad2ad;
          query.hints_._0_8_ = &query.hints_.ai_addrlen;
          std::__cxx11::string::_M_construct<char_const*>((string *)&query,paVar4,paVar4);
          brkprt.first._M_dataplus._M_p = (pointer)&brkprt.first.field_2;
          brkprt.first._M_string_length = 0;
          brkprt.first.field_2._M_local_buf[0] = '\0';
          port._M_dataplus._M_p = (pointer)&port.field_2;
          port._M_string_length = 0;
          port.field_2._M_local_buf[0] = '\0';
          gmlc::networking::extractInterfaceAndPortString
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&cmd,(string *)&query);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&brkprt,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmd);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &cmd.actionTime);
          if ((Time *)cmd.actionTime.internalTimeCode != &cmd.Tdemin) {
            operator_delete((void *)cmd.actionTime.internalTimeCode,cmd.Tdemin.internalTimeCode + 1)
            ;
          }
          if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
            operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
          }
          local_138.super_basic_resolver_iterator<asio::ip::udp>.values_.
          super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::udp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::udp>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr._0_4_ =
               (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork ==
                     IPV6) * 8 + 2;
          asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
                    ((basic_resolver_query<asio::ip::udp> *)&cmd,(protocol_type *)&local_138,
                     &brkprt.first,&port,address_configured);
          local_144.rid = localQuery.hints_._20_4_;
          asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
                    (&local_138,&resolver,(query *)&cmd);
          pVar40 = std::
                   _Rb_tree<helics::route_id,std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>,std::_Select1st<std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>>>
                   ::
                   _M_emplace_unique<helics::route_id,asio::ip::basic_resolver_entry<asio::ip::udp>const&>
                             ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>,std::_Select1st<std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>>>
                               *)&routes,&local_144,
                              (basic_resolver_entry<asio::ip::udp> *)
                              (local_138.super_basic_resolver_iterator<asio::ip::udp>.index_ * 0x60
                              + *(long *)CONCAT44(local_138.
                                                  super_basic_resolver_iterator<asio::ip::udp>.
                                                  values_.
                                                  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::udp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::udp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_,
                                                  (int)local_138.
                                                       super_basic_resolver_iterator<asio::ip::udp>.
                                                       values_.
                                                  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::udp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::udp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)));
          pAVar29 = pVar40._8_8_;
          if (local_138.super_basic_resolver_iterator<asio::ip::udp>.values_.
              super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::udp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::udp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_138.super_basic_resolver_iterator<asio::ip::udp>.values_.
                       super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::udp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::udp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
            pAVar29 = extraout_RDX_04;
          }
          if ((byte *)cmd.payload.buffer._M_elems._16_8_ != cmd.payload.buffer._M_elems + 0x20) {
            operator_delete((void *)cmd.payload.buffer._M_elems._16_8_,
                            cmd.payload.buffer._M_elems._32_8_ + 1);
            pAVar29 = extraout_RDX_05;
          }
          if ((SmallBuffer *)cmd.Tdemin.internalTimeCode != &cmd.payload) {
            operator_delete((void *)cmd.Tdemin.internalTimeCode,
                            cmd.payload.buffer._M_elems._0_8_ + 1);
            pAVar29 = extraout_RDX_06;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)port._M_dataplus._M_p != &port.field_2) {
            operator_delete(port._M_dataplus._M_p,
                            CONCAT71(port.field_2._M_allocated_capacity._1_7_,
                                     port.field_2._M_local_buf[0]) + 1);
            pAVar29 = extraout_RDX_07;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)brkprt.first._M_dataplus._M_p != &brkprt.first.field_2) {
            operator_delete(brkprt.first._M_dataplus._M_p,
                            CONCAT71(brkprt.first.field_2._M_allocated_capacity._1_7_,
                                     brkprt.first.field_2._M_local_buf[0]) + 1);
            pAVar29 = extraout_RDX_08;
          }
          if ((socklen_t *)query.hints_._0_8_ != &query.hints_.ai_addrlen) {
            operator_delete((void *)query.hints_._0_8_,query.hints_._16_8_ + 1);
            pAVar29 = extraout_RDX_09;
          }
        }
        bVar10 = true;
      }
      else if (localQuery.hints_.ai_family == 0x9db) {
        bVar10 = true;
        bVar38 = false;
      }
      else if (localQuery.hints_.ai_family == 0x16570bf) {
        ActionMessage::to_string_abi_cxx11_((string *)&cmd,(ActionMessage *)&localQuery);
        sVar21 = 0x1c;
        if (rxEndpoint.impl_.data_.base.sa_family == 2) {
          sVar21 = 0x10;
        }
        in_R9.values_ = (value<fmt::v11::context> *)&rxEndpoint;
        asio::detail::socket_ops::sync_sendto1
                  (transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                   implementation_.super_base_implementation_type.socket_,
                   transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                   implementation_.super_base_implementation_type.state_,(void *)cmd._0_8_,cmd._8_8_
                   ,0,in_R9.values_,sVar21,&error);
        if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
          operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
        }
        pAVar29 = (ActionMessage *)(ulong)(uint)error._M_value;
        if (error._M_value != 0) {
          (**(code **)(*(long *)error._M_cat + 0x20))(&query);
          brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
          brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
          brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)&brkprt;
          fmt_03.size_ = 0xd;
          fmt_03.data_ = (char *)0x33;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&cmd,(v11 *)"transmit failure on sending \'close\' to receiver  {}",
                     fmt_03,args_03);
          message_05._M_str = (char *)cmd._0_8_;
          message_05._M_len._0_4_ = cmd.source_id.gid;
          message_05._M_len._4_4_ = cmd.source_handle.hid;
          CommsInterface::logError((CommsInterface *)this,message_05);
          pAVar29 = extraout_RDX_00;
          if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
            operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
            pAVar29 = extraout_RDX_01;
          }
          if ((socklen_t *)query.hints_._0_8_ != &query.hints_.ai_addrlen) {
            operator_delete((void *)query.hints_._0_8_,query.hints_._16_8_ + 1);
            pAVar29 = extraout_RDX_02;
          }
        }
        bVar10 = true;
        bVar13 = true;
      }
    }
    else {
      bVar10 = false;
    }
LAB_002ad2ad:
    if (!bVar10) {
      if (aVar11 == cmd_broker_setup) {
        ActionMessage::to_string_abi_cxx11_((string *)&cmd,(ActionMessage *)&localQuery);
        sVar21 = 0x1c;
        if (rxEndpoint.impl_.data_.base.sa_family == 2) {
          sVar21 = 0x10;
        }
        in_R9.values_ = (value<fmt::v11::context> *)&rxEndpoint;
        asio::detail::socket_ops::sync_sendto1
                  (transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                   implementation_.super_base_implementation_type.socket_,
                   transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                   implementation_.super_base_implementation_type.state_,(void *)cmd._0_8_,cmd._8_8_
                   ,0,in_R9.values_,sVar21,&error);
        if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
          operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
        }
        if (error._M_value != 0) {
          (**(code **)(*(long *)error._M_cat + 0x20))(&query);
          brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
          brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
          brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)&brkprt;
          fmt_04.size_ = 0xd;
          fmt_04.data_ = (char *)0x38;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&cmd,
                     (v11 *)"transmit failure sending control message to receiver  {}",fmt_04,
                     args_04);
          message_06._M_str = (char *)cmd._0_8_;
          message_06._M_len._0_4_ = cmd.source_id.gid;
          message_06._M_len._4_4_ = cmd.source_handle.hid;
          CommsInterface::logWarning((CommsInterface *)this,message_06);
          goto LAB_002ad7ac;
        }
      }
      else if (aVar11 == cmd_ignore) {
        if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
          prettyPrintString_abi_cxx11_((string *)&query,(helics *)&localQuery,pAVar29);
          brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
          brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
          brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
          args_06.field_1.args_ = in_R9.args_;
          args_06.desc_ = (unsigned_long_long)&brkprt;
          fmt_06.size_ = 0xd;
          fmt_06.data_ = (char *)0x4c;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&cmd,
                     (v11 *)
                     "message directed to broker of comm system with no broker, message dropped {}",
                     fmt_06,args_06);
          message_08._M_str = (char *)cmd._0_8_;
          message_08._M_len._0_4_ = cmd.source_id.gid;
          message_08._M_len._4_4_ = cmd.source_handle.hid;
          CommsInterface::logWarning((CommsInterface *)this,message_08);
        }
        else {
          ActionMessage::to_string_abi_cxx11_((string *)&cmd,(ActionMessage *)&localQuery);
          sVar21 = 0x1c;
          if (broker_endpoint.impl_.data_.base.sa_family == 2) {
            sVar21 = 0x10;
          }
          in_R9.values_ = (value<fmt::v11::context> *)&broker_endpoint;
          asio::detail::socket_ops::sync_sendto1
                    (transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                     implementation_.super_base_implementation_type.socket_,
                     transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                     implementation_.super_base_implementation_type.state_,(void *)cmd._0_8_,
                     cmd._8_8_,0,in_R9.values_,sVar21,&error);
          if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
            operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
          }
          if (error._M_value == 0) goto LAB_002ad7ed;
          (**(code **)(*(long *)error._M_cat + 0x20))(&query);
          brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
          brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
          brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)&brkprt;
          fmt_02.size_ = 0xd;
          fmt_02.data_ = (char *)0x26;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&cmd,(v11 *)"transmit failure sending to broker  {}",fmt_02,args_02);
          message_04._M_str = (char *)cmd._0_8_;
          message_04._M_len._0_4_ = cmd.source_id.gid;
          message_04._M_len._4_4_ = cmd.source_handle.hid;
          CommsInterface::logWarning((CommsInterface *)this,message_04);
        }
LAB_002ad7ac:
        lVar20 = cmd._16_8_;
        _Var33._M_p = (pointer)cmd._0_8_;
        if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
LAB_002ad7c0:
          operator_delete(_Var33._M_p,lVar20 + 1);
        }
LAB_002ad7c8:
        lVar20 = query.hints_._16_8_;
        _Var33._M_p = (pointer)query.hints_._0_8_;
        if ((socklen_t *)query.hints_._0_8_ != &query.hints_.ai_addrlen) {
LAB_002ad7e5:
          operator_delete(_Var33._M_p,lVar20 + 1);
        }
      }
      else {
        p_Var24 = &routes._M_t._M_impl.super__Rb_tree_header._M_header;
        for (p_Var27 = routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var27 != (_Rb_tree_header *)0x0;
            p_Var27 = (&p_Var27->_M_left)[(action_t)*(size_t *)(p_Var27 + 1) < aVar11]) {
          if (aVar11 <= (action_t)*(size_t *)(p_Var27 + 1)) {
            p_Var24 = p_Var27;
          }
        }
        p_Var5 = &routes._M_t._M_impl.super__Rb_tree_header;
        p_Var37 = p_Var5;
        if (((_Rb_tree_header *)p_Var24 != p_Var5) &&
           (p_Var37 = (_Rb_tree_header *)p_Var24,
           aVar11 < (action_t)((_Rb_tree_header *)p_Var24)->_M_node_count)) {
          p_Var37 = p_Var5;
        }
        if (p_Var37 == p_Var5) {
          if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
            if (localQuery.hints_.ai_flags < 0x87) {
              uVar18 = localQuery.hints_.ai_flags + 3;
              if ((0x26 < uVar18) ||
                 (((0x600001fe1U >> ((ulong)uVar18 & 0x3f) & 1) == 0 &&
                  (((ulong)uVar18 != 0x26 ||
                   (localQuery.hints_.ai_canonname != (char *)0x7fffffffffffffff)))))) {
LAB_002adbac:
                query.hints_._0_8_ = &query.hints_.ai_addrlen;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&query,"(udp) unknown route, message dropped ","");
                prettyPrintString_abi_cxx11_((string *)&brkprt,(helics *)&localQuery,command);
                uVar28 = 0xf;
                if ((socklen_t *)query.hints_._0_8_ != &query.hints_.ai_addrlen) {
                  uVar28 = query.hints_._16_8_;
                }
                if (uVar28 < brkprt.first._M_string_length + query.hints_._8_8_) {
                  uVar28 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)brkprt.first._M_dataplus._M_p != &brkprt.first.field_2) {
                    uVar28 = CONCAT71(brkprt.first.field_2._M_allocated_capacity._1_7_,
                                      brkprt.first.field_2._M_local_buf[0]);
                  }
                  if (uVar28 < brkprt.first._M_string_length + query.hints_._8_8_)
                  goto LAB_002adc3a;
                  pbVar25 = CLI::std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&brkprt,0,0,(char *)query.hints_._0_8_,query.hints_._8_8_);
                }
                else {
LAB_002adc3a:
                  pbVar25 = CLI::std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&query,brkprt.first._M_dataplus._M_p,
                                      brkprt.first._M_string_length);
                }
                cmd._0_8_ = &cmd.dest_id;
                pcVar7 = (pbVar25->_M_dataplus)._M_p;
                paVar1 = &pbVar25->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar7 == paVar1) {
                  cmd._16_8_ = paVar1->_M_allocated_capacity;
                  cmd._24_8_ = *(undefined8 *)((long)&pbVar25->field_2 + 8);
                }
                else {
                  cmd._16_8_ = paVar1->_M_allocated_capacity;
                  cmd._0_8_ = pcVar7;
                }
                cmd._8_8_ = pbVar25->_M_string_length;
                (pbVar25->_M_dataplus)._M_p = (pointer)paVar1;
                pbVar25->_M_string_length = 0;
                paVar1->_M_local_buf[0] = '\0';
                message_10._M_str = (char *)cmd._0_8_;
                message_10._M_len = cmd._8_8_;
                CommsInterface::logWarning((CommsInterface *)this,message_10);
                if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
                  operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)brkprt.first._M_dataplus._M_p != &brkprt.first.field_2) {
                  lVar20 = CONCAT71(brkprt.first.field_2._M_allocated_capacity._1_7_,
                                    brkprt.first.field_2._M_local_buf[0]);
                  _Var33._M_p = brkprt.first._M_dataplus._M_p;
                  goto LAB_002ad7c0;
                }
                goto LAB_002ad7c8;
              }
            }
            else if ((((3 < localQuery.hints_.ai_flags - 0x3eeU) ||
                      (localQuery.hints_.ai_flags - 0x3eeU == 1)) &&
                     (localQuery.hints_.ai_flags != 0x87)) && (localQuery.hints_.ai_flags != 0x89))
            goto LAB_002adbac;
          }
          else {
            ActionMessage::to_string_abi_cxx11_((string *)&cmd,(ActionMessage *)&localQuery);
            sVar21 = 0x1c;
            if (broker_endpoint.impl_.data_.base.sa_family == 2) {
              sVar21 = 0x10;
            }
            in_R9.values_ = (value<fmt::v11::context> *)&broker_endpoint;
            asio::detail::socket_ops::sync_sendto1
                      (transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_
                       .implementation_.super_base_implementation_type.socket_,
                       transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_
                       .implementation_.super_base_implementation_type.state_,(void *)cmd._0_8_,
                       cmd._8_8_,0,in_R9.values_,sVar21,&error);
            if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
              operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
            }
            if (error._M_value != 0) {
              (**(code **)(*(long *)error._M_cat + 0x20))(&query);
              brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
              brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
              brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
              args_07.field_1.values_ = in_R9.values_;
              args_07.desc_ = (unsigned_long_long)&brkprt;
              fmt_07.size_ = 0xd;
              fmt_07.data_ = (char *)0x26;
              ::fmt::v11::vformat_abi_cxx11_
                        ((string *)&cmd,(v11 *)"transmit failure sending to broker  {}",fmt_07,
                         args_07);
              message_09._M_str = (char *)cmd._0_8_;
              message_09._M_len._0_4_ = cmd.source_id.gid;
              message_09._M_len._4_4_ = cmd.source_handle.hid;
              CommsInterface::logWarning((CommsInterface *)this,message_09);
              goto LAB_002ad7ac;
            }
          }
        }
        else {
          ActionMessage::to_string_abi_cxx11_((string *)&cmd,(ActionMessage *)&localQuery);
          in_R9.values_ = (value<fmt::v11::context> *)((long)&p_Var37->_M_node_count + 4);
          sVar21 = 0x1c;
          if (*(short *)((long)&p_Var37->_M_node_count + 4) == 2) {
            sVar21 = 0x10;
          }
          asio::detail::socket_ops::sync_sendto1
                    (transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                     implementation_.super_base_implementation_type.socket_,
                     transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                     implementation_.super_base_implementation_type.state_,(void *)cmd._0_8_,
                     cmd._8_8_,0,in_R9.values_,sVar21,&error);
          if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
            operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
          }
          if (error._M_value != 0) {
            (**(code **)(*(long *)error._M_cat + 0x20))(&brkprt);
            cmd._0_8_ = CONCAT44(cmd.messageID,aVar11);
            cmd._16_8_ = brkprt.first._M_dataplus._M_p;
            cmd.counter = (undefined2)brkprt.first._M_string_length;
            cmd.flags = brkprt.first._M_string_length._2_2_;
            cmd.sequenceID = brkprt.first._M_string_length._4_4_;
            args_05.field_1.values_ = in_R9.values_;
            args_05.desc_ = (unsigned_long_long)&cmd;
            fmt_05.size_ = 0xd1;
            fmt_05.data_ = (char *)0x27;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)&query,(v11 *)"transmit failure sending to route {}:{}",fmt_05,
                       args_05);
            message_07._M_str = (char *)query.hints_._0_8_;
            message_07._M_len._0_4_ = query.hints_.ai_socktype;
            message_07._M_len._4_4_ = query.hints_.ai_protocol;
            CommsInterface::logWarning((CommsInterface *)this,message_07);
            if ((socklen_t *)query.hints_._0_8_ != &query.hints_.ai_addrlen) {
              operator_delete((void *)query.hints_._0_8_,query.hints_._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)brkprt.first._M_dataplus._M_p != &brkprt.first.field_2) {
              lVar20 = CONCAT71(brkprt.first.field_2._M_allocated_capacity._1_7_,
                                brkprt.first.field_2._M_local_buf[0]);
              _Var33._M_p = brkprt.first._M_dataplus._M_p;
              goto LAB_002ad7e5;
            }
          }
        }
      }
    }
LAB_002ad7ed:
    ActionMessage::~ActionMessage((ActionMessage *)&localQuery);
  } while (bVar38);
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>,_std::_Select1st<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
  ::clear(&routes._M_t);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED) {
    if (bVar13) {
      this_00 = &(this->super_NetworkCommsInterface).super_CommsInterface.rxTrigger;
      cmd.messageAction = 3000;
      cmd.messageID = 0;
      bVar38 = gmlc::concurrency::TriggerVariable::wait_for(this_00,(milliseconds *)&cmd);
      if (bVar38) goto LAB_002ae067;
      cmd._0_8_ = &cmd.dest_id;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cmd,"close","");
      pvVar30 = (void *)cmd._8_8_;
      if (cmd._8_8_ != 0) {
        pvVar30 = (void *)cmd._0_8_;
      }
      aVar34.values_ = (value<fmt::v11::context> *)&rxEndpoint;
      sVar21 = 0x1c;
      if (rxEndpoint.impl_.data_.base.sa_family == 2) {
        sVar21 = 0x10;
      }
      asio::detail::socket_ops::sync_sendto1
                (transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                 implementation_.super_base_implementation_type.socket_,
                 transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                 implementation_.super_base_implementation_type.state_,pvVar30,cmd._8_8_,0,
                 aVar34.values_,sVar21,&error);
      if (error._M_value != 0) {
        (**(code **)(*(long *)error._M_cat + 0x20))(&query);
        brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
        brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
        brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
        args_08.field_1.values_ = aVar34.values_;
        args_08.desc_ = (unsigned_long_long)&brkprt;
        fmt_08.size_ = 0xd;
        fmt_08.data_ = (char *)0x31;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&localQuery,(v11 *)"transmit failure sending close to receiver III:{}",
                   fmt_08,args_08);
        message_11._M_str = (char *)localQuery.hints_._0_8_;
        message_11._M_len._0_4_ = localQuery.hints_.ai_socktype;
        message_11._M_len._4_4_ = localQuery.hints_.ai_protocol;
        CommsInterface::logWarning((CommsInterface *)this,message_11);
        goto LAB_002ae005;
      }
      localQuery.hints_.ai_flags = 2000;
      localQuery.hints_.ai_family = 0;
      bVar38 = gmlc::concurrency::TriggerVariable::wait_for(this_00,(milliseconds *)&localQuery);
      if (!bVar38) {
        message_14._M_str = "udp rx not responding to close signal";
        message_14._M_len = 0x25;
        CommsInterface::logWarning((CommsInterface *)this,message_14);
      }
    }
    else {
      cmd._0_8_ = &cmd.dest_id;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cmd,"close","");
      pvVar30 = (void *)cmd._8_8_;
      if (cmd._8_8_ != 0) {
        pvVar30 = (void *)cmd._0_8_;
      }
      aVar34.values_ = (value<fmt::v11::context> *)&rxEndpoint;
      sVar21 = 0x1c;
      if (rxEndpoint.impl_.data_.base.sa_family == 2) {
        sVar21 = 0x10;
      }
      asio::detail::socket_ops::sync_sendto1
                (transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                 implementation_.super_base_implementation_type.socket_,
                 transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                 implementation_.super_base_implementation_type.state_,pvVar30,cmd._8_8_,0,
                 aVar34.values_,sVar21,&error);
      if (error._M_value != 0) {
        (**(code **)(*(long *)error._M_cat + 0x20))(&query);
        brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
        brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
        brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
        args_09.field_1.values_ = aVar34.values_;
        args_09.desc_ = (unsigned_long_long)&brkprt;
        fmt_09.size_ = 0xd;
        fmt_09.data_ = &DAT_00000030;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&localQuery,(v11 *)"transmit failure sending close to receiver II:{}",
                   fmt_09,args_09);
        message_12._M_str = (char *)localQuery.hints_._0_8_;
        message_12._M_len._0_4_ = localQuery.hints_.ai_socktype;
        message_12._M_len._4_4_ = localQuery.hints_.ai_protocol;
        CommsInterface::logWarning((CommsInterface *)this,message_12);
LAB_002ae005:
        if ((socklen_t *)localQuery.hints_._0_8_ != &localQuery.hints_.ai_addrlen) {
          operator_delete((void *)localQuery.hints_._0_8_,localQuery.hints_._16_8_ + 1);
        }
        if ((socklen_t *)query.hints_._0_8_ != &query.hints_.ai_addrlen) {
          operator_delete((void *)query.hints_._0_8_,query.hints_._16_8_ + 1);
        }
      }
    }
    if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
      operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
    }
  }
LAB_002ae067:
  CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
LAB_002ae074:
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>,_std::_Select1st<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
  ::~_Rb_tree(&routes._M_t);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
                   *)&transmitSocket);
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>
  ::~io_object_impl(&resolver.impl_);
  if (ioctx.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ioctx.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void UdpComms::queue_tx_function()
{
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    udp::resolver resolver(ioctx->getBaseContext());
    bool closingRx = false;
    udp::socket transmitSocket(ioctx->getBaseContext());
    transmitSocket.open(udpnet(interfaceNetwork));
    if (PortNumber >= 0) {
        promisePort.set_value(PortNumber);
    }

    std::error_code error;
    std::map<route_id, udp::endpoint> routes;  // for all the other possible routes
    udp::endpoint broker_endpoint;

    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    if (hasBroker) {
        if (brokerPort < 0) {
            brokerPort = getDefaultBrokerPort();
        }
        try {
            const udp::resolver::query query(udpnet(interfaceNetwork),
                                             brokerTargetAddress,
                                             std::to_string(brokerPort));
            // Setup the control socket for comms with the receiver
            broker_endpoint = *resolver.resolve(query);
            int retries{0};
            bool connectionEstablished{false};
            if (PortNumber.load() > 0 && NetworkCommsInterface::noAckConnection) {
                connectionEstablished = true;
            }
            const decltype(std::chrono::steady_clock::now()) startTime{
                std::chrono::steady_clock::now()};
            int errorCount{0};
            while (!connectionEstablished) {
                if (requestDisconnect.load(std::memory_order_acquire)) {
                    if (PortNumber.load() <= 0) {
                        PortNumber = -1;
                        promisePort.set_value(-1);
                    }
                    setTxStatus(ConnectionStatus::TERMINATED);
                    return;
                }
                ActionMessage cmd(CMD_PROTOCOL_PRIORITY);
                cmd.messageID = (PortNumber <= 0) ? REQUEST_PORTS : CONNECTION_REQUEST;
                cmd.setStringData(brokerName, brokerInitString);
                transmitSocket.send_to(asio::buffer(cmd.to_string()), broker_endpoint, 0, error);
                if (error) {
                    logError(fmt::format("error in initial send to broker {}", error.message()));
                    if (PortNumber.load() <= 0) {
                        PortNumber = -1;
                        promisePort.set_value(-1);
                    }

                    setTxStatus(ConnectionStatus::ERRORED);
                    return;
                }

                bool timeout{false};
                std::vector<char> receiveData(128);
                udp::endpoint brk;

                while ((transmitSocket.available() == 0) && (!timeout)) {
                    if (std::chrono::steady_clock::now() - startTime > connectionTimeout) {
                        timeout = true;
                    }
                    if (requestDisconnect.load(std::memory_order_acquire)) {
                        if (PortNumber.load() <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::TERMINATED);
                        return;
                    }
                    std::this_thread::sleep_for(std::chrono::milliseconds(50));
                }
                if (timeout) {
                    ++retries;
                    if (retries > maxRetries) {
                        logError("the max number of retries has been exceeded");
                        if (PortNumber.load() <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::ERRORED);
                        return;
                    }
                    continue;
                }
                auto len = transmitSocket.receive_from(asio::buffer(receiveData), brk, 0, error);
                if (error) {
                    if (errorCount++ == 0) {
                        logError(
                            fmt::format("error in initial receive broker {}", error.message()));
                    }
                    if (std::chrono::steady_clock::now() - startTime > connectionTimeout) {
                        if (PortNumber.load() <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::ERRORED);
                        logError(fmt::format("timeerror in broker receive {}", error.message()));
                        return;
                    }
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    continue;
                }
                cmd = ActionMessage(reinterpret_cast<std::byte*>(receiveData.data()), len);
                if (isProtocolCommand(cmd)) {
                    if (cmd.messageID == PORT_DEFINITIONS) {
                        loadPortDefinitions(cmd);
                        promisePort.set_value(PortNumber);
                        connectionEstablished = true;
                    } else if (cmd.messageID == CONNECTION_ACK) {
                        if (PortNumber.load() > 0) {
                            connectionEstablished = true;
                            continue;
                        }
                    } else if (cmd.messageID == NEW_BROKER_INFORMATION) {
                        logMessage("got new broker information");
                        auto brkprt = gmlc::networking::extractInterfaceAndPort(cmd.getString(0));
                        brokerPort = brkprt.second;
                        if (brkprt.first != "?") {
                            brokerTargetAddress = brkprt.first;
                        }
                        const udp::resolver::query localQuery(udpnet(interfaceNetwork),
                                                              brokerTargetAddress,
                                                              std::to_string(brokerPort));
                        // Setup the control socket for comms with the receiver
                        broker_endpoint = *resolver.resolve(localQuery);
                        continue;
                    } else if (cmd.messageID == DELAY_CONNECTION) {
                        std::this_thread::sleep_for(std::chrono::seconds(2));
                    } else if (cmd.messageID == DISCONNECT) {
                        if (PortNumber <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::TERMINATED);
                        return;
                    }
                }
            }
        }
        catch (std::exception& err) {
            logError(fmt::format("error connecting to broker {}", err.what()));
            PortNumber = -1;
            promisePort.set_value(-1);
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
    } else {
        if (PortNumber < 0) {
            PortNumber = getDefaultBrokerPort();
            promisePort.set_value(PortNumber);
        }
    }
    udp::endpoint rxEndpoint;
    if (localTargetAddress.empty() || localTargetAddress == "*" ||
        localTargetAddress == "udp://*") {
        const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                              "127.0.0.1",
                                              std::to_string(PortNumber));
        auto result = resolver.resolve(queryLocal);
        rxEndpoint = *result;
    } else {
        const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                              localTargetAddress,
                                              std::to_string(PortNumber));
        auto result = resolver.resolve(queryLocal, error);
        if (error) {
            logError(fmt::format("Unable to resolve: {}", localTargetAddress));
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
        rxEndpoint = *result;
    }

    setTxStatus(ConnectionStatus::CONNECTED);
    bool continueProcessing{true};
    while (continueProcessing) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (rid == control_route) {
                switch (cmd.messageID) {
                    case NEW_ROUTE: {
                        try {
                            const std::string newroute(cmd.payload.to_string());
                            std::string interface;
                            std::string port;
                            std::tie(interface, port) =
                                gmlc::networking::extractInterfaceAndPortString(newroute);
                            const udp::resolver::query queryNew(udpnet(interfaceNetwork),
                                                                interface,
                                                                port);

                            routes.emplace(route_id{cmd.getExtraData()},
                                           *resolver.resolve(queryNew));
                        }
                        catch (const std::exception& err) {
                            logError(fmt::format("unable to resolve new route: {}", err.what()));
                        }
                        processed = true;
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case CLOSE_RECEIVER:
                        transmitSocket.send_to(asio::buffer(cmd.to_string()), rxEndpoint, 0, error);
                        if (error) {
                            logError(
                                fmt::format("transmit failure on sending 'close' to receiver  {}",
                                            error.message()));
                        }
                        closingRx = true;
                        processed = true;
                        break;
                    case DISCONNECT:
                        continueProcessing = false;
                        processed = true;
                        break;
                    default:
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }

        if (rid == parent_route_id) {
            if (hasBroker) {
                transmitSocket.send_to(asio::buffer(cmd.to_string()), broker_endpoint, 0, error);
                if (error) {
                    logWarning(
                        fmt::format("transmit failure sending to broker  {}", error.message()));
                }
            } else {
                logWarning(fmt::format(
                    "message directed to broker of comm system with no broker, message dropped {}",
                    prettyPrintString(cmd)));
            }
        } else if (rid == control_route) {  // send to rx thread loop
            transmitSocket.send_to(asio::buffer(cmd.to_string()), rxEndpoint, 0, error);
            if (error) {
                logWarning(fmt::format("transmit failure sending control message to receiver  {}",
                                       error.message()));
            }
        } else {
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                transmitSocket.send_to(asio::buffer(cmd.to_string()), rt_find->second, 0, error);
                if (error) {
                    logWarning(fmt::format("transmit failure sending to route {}:{}",
                                           rid.baseValue(),
                                           error.message()));
                }
            } else {
                if (hasBroker) {
                    transmitSocket.send_to(asio::buffer(cmd.to_string()),
                                           broker_endpoint,
                                           0,
                                           error);
                    if (error) {
                        logWarning(
                            fmt::format("transmit failure sending to broker  {}", error.message()));
                    }
                } else {
                    if (!isDisconnectCommand(cmd)) {
                        logWarning(std::string("(udp) unknown route, message dropped ") +
                                   prettyPrintString(cmd));
                    }
                }
            }
        }
    }
    routes.clear();
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        if (closingRx) {
            if (!(rxTrigger.wait_for(std::chrono::milliseconds(3000)))) {
                std::string cls("close");
                transmitSocket.send_to(asio::buffer(cls), rxEndpoint, 0, error);
                if (error) {
                    logWarning(fmt::format("transmit failure sending close to receiver III:{}",
                                           error.message()));
                } else {
                    if (!(rxTrigger.wait_for(std::chrono::milliseconds(2000)))) {
                        logWarning("udp rx not responding to close signal");
                    }
                }
            }
        } else {
            std::string cls("close");
            transmitSocket.send_to(asio::buffer(cls), rxEndpoint, 0, error);
            if (error) {
                logWarning(fmt::format("transmit failure sending close to receiver II:{}",
                                       error.message()));
            }
        }
    }

    setTxStatus(ConnectionStatus::TERMINATED);
}